

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file.cpp
# Opt level: O0

void __thiscall cppcms::http::file::save_to(file *this,string *filename)

{
  bool bVar1;
  int iVar2;
  impl_data *piVar3;
  char *pcVar4;
  char *__new;
  int __fd;
  long in_RDI;
  istream *in_stack_000001b0;
  string *in_stack_000001b8;
  file *in_stack_000001c0;
  file_buffer *in_stack_ffffffffffffff68;
  fpos<__mbstate_t> *in_stack_ffffffffffffff70;
  string local_60 [32];
  string local_40 [32];
  undefined8 local_20;
  undefined8 local_18;
  
  piVar3 = booster::hold_ptr<cppcms::http::file::impl_data>::operator->
                     ((hold_ptr<cppcms::http::file::impl_data> *)(in_RDI + 0x448));
  std::ios::clear((int)piVar3 + 0xf8 + (int)*(undefined8 *)(*(long *)&piVar3->in + -0x18));
  piVar3 = booster::hold_ptr<cppcms::http::file::impl_data>::operator->
                     ((hold_ptr<cppcms::http::file::impl_data> *)(in_RDI + 0x448));
  std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffff70,(streamoff)in_stack_ffffffffffffff68);
  std::istream::seekg(&piVar3->in,local_20,local_18);
  booster::hold_ptr<cppcms::http::file::impl_data>::operator->
            ((hold_ptr<cppcms::http::file::impl_data> *)(in_RDI + 0x448));
  std::streambuf::pubsync();
  piVar3 = booster::hold_ptr<cppcms::http::file::impl_data>::operator->
                     ((hold_ptr<cppcms::http::file::impl_data> *)(in_RDI + 0x448));
  bVar1 = impl::file_buffer::in_memory(&piVar3->fb);
  if (bVar1) {
    booster::hold_ptr<cppcms::http::file::impl_data>::operator->
              ((hold_ptr<cppcms::http::file::impl_data> *)(in_RDI + 0x448));
    save_by_copy(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
  }
  else {
    booster::hold_ptr<cppcms::http::file::impl_data>::operator->
              ((hold_ptr<cppcms::http::file::impl_data> *)(in_RDI + 0x448));
    impl::file_buffer::name_abi_cxx11_(in_stack_ffffffffffffff68);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    __new = (char *)std::__cxx11::string::c_str();
    iVar2 = rename(pcVar4,__new);
    __fd = (int)__new;
    std::__cxx11::string::~string(local_40);
    if (iVar2 != 0) {
      booster::hold_ptr<cppcms::http::file::impl_data>::operator->
                ((hold_ptr<cppcms::http::file::impl_data> *)(in_RDI + 0x448));
      save_by_copy(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
      piVar3 = booster::hold_ptr<cppcms::http::file::impl_data>::operator->
                         ((hold_ptr<cppcms::http::file::impl_data> *)(in_RDI + 0x448));
      __fd = (int)piVar3;
      impl::file_buffer::name_abi_cxx11_(in_stack_ffffffffffffff68);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      remove(pcVar4);
      std::__cxx11::string::~string(local_60);
    }
    piVar3 = booster::hold_ptr<cppcms::http::file::impl_data>::operator->
                       ((hold_ptr<cppcms::http::file::impl_data> *)(in_RDI + 0x448));
    impl::file_buffer::close(&piVar3->fb,__fd);
    *(uint *)(in_RDI + 0x440) = *(uint *)(in_RDI + 0x440) & 0xfffffffe | 1;
  }
  return;
}

Assistant:

void file::save_to(std::string const &filename)
{
	d->in.clear(); 
	d->in.seekg(0);
	d->fb.pubsync();

	if(d->fb.in_memory()) {
		save_by_copy(filename,d->in);
		return;
	}
	#ifdef CPPCMS_WIN32
		d->fb.close();
		/// we can't move opened file on windows as it would be locked 
		if(booster::nowide::rename(d->fb.name().c_str(),filename.c_str())!=0) {
			booster::nowide::ifstream tmp(d->fb.name().c_str(),std::ios_base::binary | std::ios_base::in);
			if(!tmp) {
				throw cppcms_error("Failed to reopen file");
			}
			save_by_copy(filename,tmp);
			tmp.close();
			booster::nowide::remove(d->fb.name().c_str());
		}
	#else
		if(booster::nowide::rename(d->fb.name().c_str(),filename.c_str())!=0) {
			save_by_copy(filename,d->in);
			booster::nowide::remove(d->fb.name().c_str());
		}
		d->fb.close();
	#endif
	removed_ = 1;
}